

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sophia_interface.cpp
# Opt level: O2

double __thiscall sophia_interface::Ef(sophia_interface *this,double x,double th,double w)

{
  runtime_error *this_00;
  double dVar1;
  
  dVar1 = 0.0;
  if (th < x) {
    if ((x <= th) || (th + w <= x)) {
      if (x < th + w) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"error in function Ef");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      dVar1 = 1.0;
    }
    else {
      dVar1 = (x - th) / w;
    }
  }
  return dVar1;
}

Assistant:

double sophia_interface::Ef(double x, double th, double w) {
    double wth = w + th;
    if (x <= th) {
        return 0.;
    } else if (x > th && x < wth) {
        return (x - th) / w;
    } else if (x >= wth) {
        return 1.;
    } else {
        throw std::runtime_error("error in function Ef");
    }
}